

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

void setpath(lua_State *L,char *fieldname,char *envname,char *dft)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_468 [8];
  luaL_Buffer b;
  size_t len;
  char *path;
  char *nver;
  char *dftmark;
  char *dft_local;
  char *envname_local;
  char *fieldname_local;
  lua_State *L_local;
  
  pcVar2 = lua_pushfstring(L,"%s%s",envname,"_5_4");
  len = (size_t)getenv(pcVar2);
  if ((char *)len == (char *)0x0) {
    len = (size_t)getenv(envname);
  }
  if ((len == 0) || (iVar1 = noenv(L), iVar1 != 0)) {
    lua_pushstring(L,dft);
  }
  else {
    pcVar2 = strstr((char *)len,";;");
    if (pcVar2 == (char *)0x0) {
      lua_pushstring(L,(char *)len);
    }
    else {
      b.init._1016_8_ = strlen((char *)len);
      luaL_buffinit(L,(luaL_Buffer *)local_468);
      if (len < pcVar2) {
        luaL_addlstring((luaL_Buffer *)local_468,(char *)len,(long)pcVar2 - len);
        if (b.b <= b.size) {
          luaL_prepbuffsize((luaL_Buffer *)local_468,1);
        }
        *(char *)((long)local_468 + b.size) = ';';
        b.size = b.size + 1;
      }
      luaL_addstring((luaL_Buffer *)local_468,dft);
      if (pcVar2 < (char *)(len + b.init._1016_8_ + -2)) {
        if (b.b <= b.size) {
          luaL_prepbuffsize((luaL_Buffer *)local_468,1);
        }
        *(char *)((long)local_468 + b.size) = ';';
        b.size = b.size + 1;
        luaL_addlstring((luaL_Buffer *)local_468,pcVar2 + 2,
                        (len + b.init._1016_8_ + -2) - (long)pcVar2);
      }
      luaL_pushresult((luaL_Buffer *)local_468);
    }
  }
  lua_setfield(L,-3,fieldname);
  lua_settop(L,-2);
  return;
}

Assistant:

static void setpath (lua_State *L, const char *fieldname,
                                   const char *envname,
                                   const char *dft) {
  const char *dftmark;
  const char *nver = lua_pushfstring(L, "%s%s", envname, LUA_VERSUFFIX);
  const char *path = getenv(nver);  /* try versioned name */
  if (path == NULL)  /* no versioned environment variable? */
    path = getenv(envname);  /* try unversioned name */
  if (path == NULL || noenv(L))  /* no environment variable? */
    lua_pushstring(L, dft);  /* use default */
  else if ((dftmark = strstr(path, LUA_PATH_SEP LUA_PATH_SEP)) == NULL)
    lua_pushstring(L, path);  /* nothing to change */
  else {  /* path contains a ";;": insert default path in its place */
    size_t len = strlen(path);
    luaL_Buffer b;
    luaL_buffinit(L, &b);
    if (path < dftmark) {  /* is there a prefix before ';;'? */
      luaL_addlstring(&b, path, dftmark - path);  /* add it */
      luaL_addchar(&b, *LUA_PATH_SEP);
    }
    luaL_addstring(&b, dft);  /* add default */
    if (dftmark < path + len - 2) {  /* is there a suffix after ';;'? */
      luaL_addchar(&b, *LUA_PATH_SEP);
      luaL_addlstring(&b, dftmark + 2, (path + len - 2) - dftmark);
    }
    luaL_pushresult(&b);
  }
  setprogdir(L);
  lua_setfield(L, -3, fieldname);  /* package[fieldname] = path value */
  lua_pop(L, 1);  /* pop versioned variable name ('nver') */
}